

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> * __thiscall
libtorrent::aux::torrent::get_hashes
          (vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           *__return_storage_ptr__,torrent *this,hash_request *req)

{
  bool bVar1;
  element_type *this_00;
  value_type *this_01;
  value_type *f;
  hash_request *req_local;
  torrent *this_local;
  
  this_00 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  bVar1 = torrent_info::is_valid(this_00);
  if (bVar1) {
    this_01 = container_wrapper<libtorrent::aux::merkle_tree,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
              ::operator[](&this->m_merkle_trees,
                           (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                           (req->file).m_val);
    merkle_tree::get_hashes
              (__return_storage_ptr__,this_01,req->base,req->index,req->count,req->proof_layers);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<sha256_hash> torrent::get_hashes(hash_request const& req) const
	{
		TORRENT_ASSERT(m_torrent_file->is_valid());
		if (!m_torrent_file->is_valid()) return {};
		TORRENT_ASSERT(validate_hash_request(req, m_torrent_file->files()));

		auto const& f = m_merkle_trees[req.file];

		return f.get_hashes(req.base, req.index, req.count, req.proof_layers);
	}